

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O1

void u_parseDelimitedFile
               (char *filename,char delimiter,char *(*fields) [2],int32_t fieldCount,
               UParseLineFn *lineFn,void *context,UErrorCode *pErrorCode)

{
  bool bVar1;
  int iVar2;
  UErrorCode UVar3;
  FileStream *fileStream;
  char *pcVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  char line [10000];
  byte local_2748 [9];
  byte local_273f;
  byte local_273e [9998];
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (((fieldCount < 1) || (fields == (char *(*) [2])0x0)) || (lineFn == (UParseLineFn *)0x0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if (((filename == (char *)0x0) || (*filename == '\0')) ||
         ((*filename == '-' && (filename[1] == '\0')))) {
        bVar1 = true;
        fileStream = T_FileStream_stdin();
      }
      else {
        fileStream = T_FileStream_open(filename,"r");
        bVar1 = false;
      }
      if (fileStream == (FileStream *)0x0) {
        *pErrorCode = U_FILE_ACCESS_ERROR;
      }
      else {
        pcVar4 = T_FileStream_readLine(fileStream,(char *)local_2748,10000);
        if (pcVar4 != (char *)0x0) {
LAB_001ed9c4:
          sVar5 = strlen((char *)local_2748);
          pbVar10 = local_2748;
          if (0 < (long)sVar5) {
            pbVar6 = local_2748 + sVar5;
            do {
              if ((0x20 < (ulong)pbVar6[-1]) ||
                 ((0x100002600U >> ((ulong)pbVar6[-1] & 0x3f) & 1) == 0)) break;
              pbVar6 = pbVar6 + -1;
              *pbVar6 = 0;
            } while (pbVar10 < pbVar6);
          }
          pbVar6 = local_273e;
          pbVar11 = &local_273f;
          pbVar7 = local_2748 + 2;
          for (; uVar8 = (ulong)*pbVar10, uVar8 < 0x24; pbVar10 = pbVar10 + 1) {
            if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
              if (uVar8 == 0x23) goto LAB_001eda32;
              break;
            }
            pbVar7 = pbVar7 + 1;
            pbVar11 = pbVar11 + 1;
            pbVar6 = pbVar6 + 1;
          }
          goto LAB_001edace;
        }
LAB_001edc00:
        if (!bVar1) {
          T_FileStream_close(fileStream);
        }
      }
    }
  }
  return;
LAB_001eda32:
  uVar9 = pbVar7[-1] - 9;
  if (0x37 < uVar9) goto LAB_001edace;
  if ((0x800013UL >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
    if ((ulong)uVar9 == 0x37) goto LAB_001eda59;
    goto LAB_001edace;
  }
  pbVar7 = pbVar7 + 1;
  pbVar11 = pbVar11 + 1;
  pbVar6 = pbVar6 + 1;
  goto LAB_001eda32;
LAB_001eda59:
  while (((ulong)pbVar11[-7] < 0x21 && ((0x100002600U >> ((ulong)pbVar11[-7] & 0x3f) & 1) != 0))) {
    pbVar11 = pbVar11 + 1;
    pbVar6 = pbVar6 + 1;
  }
  iVar2 = strncmp((char *)(pbVar11 + -7),"missing",7);
  pbVar10 = local_2748;
  if (iVar2 == 0) {
    for (; pbVar10 = pbVar6, uVar8 = (ulong)*pbVar11, uVar8 < 0x3b; pbVar11 = pbVar11 + 1) {
      if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0x3a) goto LAB_001edab1;
        break;
      }
      pbVar6 = pbVar10 + 1;
    }
LAB_001edace:
    pbVar10 = local_2748;
  }
LAB_001edad1:
  UVar3 = U_USING_DEFAULT_WARNING;
  if (pbVar10 == local_2748) {
    UVar3 = U_ZERO_ERROR;
  }
  *pErrorCode = UVar3;
  if ((*pbVar10 != 0x23) && (*pbVar10 != 0)) {
    pbVar6 = (byte *)strchr((char *)pbVar10,0x23);
    pbVar7 = pbVar10;
    pbVar11 = pbVar6;
    if (pbVar6 != (byte *)0x0) {
      while (((pbVar10 < pbVar6 && (pbVar11 = pbVar6, (ulong)pbVar6[-1] < 0x21)) &&
             ((0x100002600U >> ((ulong)pbVar6[-1] & 0x3f) & 1) != 0))) {
        pbVar6 = pbVar6 + -1;
        pbVar11 = pbVar10;
      }
      *pbVar11 = 0;
    }
    for (; uVar8 = (ulong)*pbVar7, uVar8 < 0x21; pbVar7 = pbVar7 + 1) {
      if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0) goto LAB_001edbe3;
        break;
      }
    }
    if (0 < fieldCount) {
      uVar8 = 0;
      pbVar6 = pbVar10;
LAB_001edb70:
      do {
        pbVar11 = pbVar6;
        if (*pbVar11 != delimiter) {
          pbVar6 = pbVar11 + 1;
          if (*pbVar11 != 0) goto LAB_001edb70;
        }
        fields[uVar8][0] = (char *)pbVar10;
        fields[uVar8][1] = (char *)pbVar11;
        pbVar10 = pbVar11 + 1;
        if ((*pbVar11 == 0) && (pbVar10 = pbVar11, uVar8 + 1 < (ulong)(uint)fieldCount)) {
          *pErrorCode = U_PARSE_ERROR;
          break;
        }
        uVar8 = uVar8 + 1;
        pbVar6 = pbVar10;
      } while (uVar8 != (uint)fieldCount);
    }
    if ((U_ZERO_ERROR < *pErrorCode) ||
       ((*lineFn)(context,fields,fieldCount,pErrorCode), U_ZERO_ERROR < *pErrorCode))
    goto LAB_001edc00;
  }
LAB_001edbe3:
  pcVar4 = T_FileStream_readLine(fileStream,(char *)local_2748,10000);
  if (pcVar4 == (char *)0x0) goto LAB_001edc00;
  goto LAB_001ed9c4;
LAB_001edab1:
  while (((ulong)*pbVar10 < 0x21 && ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))) {
    pbVar10 = pbVar10 + 1;
  }
  goto LAB_001edad1;
}

Assistant:

U_CAPI void U_EXPORT2
u_parseDelimitedFile(const char *filename, char delimiter,
                     char *fields[][2], int32_t fieldCount,
                     UParseLineFn *lineFn, void *context,
                     UErrorCode *pErrorCode) {
    FileStream *file;
    char line[10000];
    char *start, *limit;
    int32_t i, length;

    if(U_FAILURE(*pErrorCode)) {
        return;
    }

    if(fields==NULL || lineFn==NULL || fieldCount<=0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    if(filename==NULL || *filename==0 || (*filename=='-' && filename[1]==0)) {
        filename=NULL;
        file=T_FileStream_stdin();
    } else {
        file=T_FileStream_open(filename, "r");
    }
    if(file==NULL) {
        *pErrorCode=U_FILE_ACCESS_ERROR;
        return;
    }

    while(T_FileStream_readLine(file, line, sizeof(line))!=NULL) {
        /* remove trailing newline characters */
        length=(int32_t)(u_rtrim(line)-line);

        /*
         * detect a line with # @missing:
         * start parsing after that, or else from the beginning of the line
         * set the default warning for @missing lines
         */
        start=(char *)getMissingLimit(line);
        if(start==line) {
            *pErrorCode=U_ZERO_ERROR;
        } else {
            *pErrorCode=U_USING_DEFAULT_WARNING;
        }

        /* skip this line if it is empty or a comment */
        if(*start==0 || *start=='#') {
            continue;
        }

        /* remove in-line comments */
        limit=uprv_strchr(start, '#');
        if(limit!=NULL) {
            /* get white space before the pound sign */
            while(limit>start && U_IS_INV_WHITESPACE(*(limit-1))) {
                --limit;
            }

            /* truncate the line */
            *limit=0;
        }

        /* skip lines with only whitespace */
        if(u_skipWhitespace(start)[0]==0) {
            continue;
        }

        /* for each field, call the corresponding field function */
        for(i=0; i<fieldCount; ++i) {
            /* set the limit pointer of this field */
            limit=start;
            while(*limit!=delimiter && *limit!=0) {
                ++limit;
            }

            /* set the field start and limit in the fields array */
            fields[i][0]=start;
            fields[i][1]=limit;

            /* set start to the beginning of the next field, if any */
            start=limit;
            if(*start!=0) {
                ++start;
            } else if(i+1<fieldCount) {
                *pErrorCode=U_PARSE_ERROR;
                limit=line+length;
                i=fieldCount;
                break;
            }
        }

        /* too few fields? */
        if(U_FAILURE(*pErrorCode)) {
            break;
        }

        /* call the field function */
        lineFn(context, fields, fieldCount, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            break;
        }
    }

    if(filename!=NULL) {
        T_FileStream_close(file);
    }
}